

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O3

vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_> *
__thiscall
tiger::trains::ai::PathCalculator::getMinPath
          (vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
           *__return_storage_ptr__,PathCalculator *this,Point *point)

{
  pointer *pppPVar1;
  iterator __position;
  Point **ppPVar2;
  pointer ppPVar3;
  Point *pPVar4;
  mapped_type *ppPVar5;
  pointer ppPVar6;
  pointer ppPVar7;
  map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
  *this_00;
  Point *temp_point;
  Point *local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->ancestors;
  local_20 = point;
  ppPVar5 = std::
            map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
            ::operator[](this_00,&local_20);
  if (*ppPVar5 != (mapped_type)0x0) {
    while( true ) {
      ppPVar5 = std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_20);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      ppPVar2 = (__return_storage_ptr__->
                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (*ppPVar5 == local_20) break;
      if (__position._M_current == ppPVar2) {
        std::
        vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>
        ::_M_realloc_insert<tiger::trains::world::Point_const*const&>
                  ((vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>
                    *)__return_storage_ptr__,__position,&local_20);
      }
      else {
        *__position._M_current = local_20;
        pppPVar1 = &(__return_storage_ptr__->
                    super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      ppPVar5 = std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_20);
      local_20 = *ppPVar5;
    }
    if (__position._M_current == ppPVar2) {
      std::
      vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>
      ::_M_realloc_insert<tiger::trains::world::Point_const*const&>
                ((vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>
                  *)__return_storage_ptr__,__position,&local_20);
      ppPVar6 = (__return_storage_ptr__->
                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_20;
      ppPVar6 = (__return_storage_ptr__->
                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppPVar6;
    }
    ppPVar3 = (__return_storage_ptr__->
              super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppPVar7 = ppPVar6 + -1;
    if (ppPVar3 < ppPVar7 && ppPVar3 != ppPVar6) {
      do {
        ppPVar6 = ppPVar3 + 1;
        pPVar4 = *ppPVar3;
        *ppPVar3 = *ppPVar7;
        *ppPVar7 = pPVar4;
        ppPVar7 = ppPVar7 + -1;
        ppPVar3 = ppPVar6;
      } while (ppPVar6 < ppPVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const world::Point *> PathCalculator::getMinPath(const world::Point *point)
{
    std::vector<const world::Point *> vec;
    const world::Point *temp_point=point;

    if (ancestors[temp_point] == nullptr)
        return vec;

    while (ancestors[temp_point] != temp_point)
    {
        vec.push_back(temp_point);
        temp_point = ancestors[temp_point];
    }

    vec.push_back(temp_point);
    std::reverse(vec.begin(), vec.end());

    return vec;
}